

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea_io.c
# Opt level: O2

int CVodeGetAdjCheckPointsInfo(void *cvode_mem,CVadjCheckPointRec *ckpnt)

{
  sunrealtype *psVar1;
  sunrealtype sVar2;
  sunrealtype *psVar3;
  int line;
  int error_code;
  sunrealtype *psVar4;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x276;
  }
  else {
    if (*(int *)((long)cvode_mem + 0xa78) != 0) {
      psVar4 = &ckpnt->step;
      psVar3 = *(sunrealtype **)(*(long *)((long)cvode_mem + 0xa70) + 0x50);
      while (psVar3 != (sunrealtype *)0x0) {
        ((CVadjCheckPointRec *)(psVar4 + -6))->my_addr = psVar3;
        psVar1 = (sunrealtype *)psVar3[0x66];
        psVar4[-5] = (sunrealtype)psVar1;
        sVar2 = psVar3[1];
        psVar4[-4] = *psVar3;
        psVar4[-3] = sVar2;
        psVar4[-2] = psVar3[0x3a];
        *(int *)(psVar4 + -1) = *(int *)(psVar3 + 0x3c);
        *psVar4 = psVar3[0x3f];
        psVar4 = psVar4 + 7;
        psVar3 = psVar1;
      }
      return 0;
    }
    msgfmt = "Illegal attempt to call before calling CVodeAdjMalloc.";
    error_code = -0x65;
    line = 0x27e;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeGetAdjCheckPointsInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodea_io.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodeGetAdjCheckPointsInfo(void* cvode_mem, CVadjCheckPointRec* ckpnt)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVckpntMem ck_mem;
  int i;

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Was ASA initialized? */
  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_ADJ, __LINE__, __func__, __FILE__, MSGCV_NO_ADJ);
    return (CV_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  ck_mem = ca_mem->ck_mem;

  i = 0;

  while (ck_mem != NULL)
  {
    ckpnt[i].my_addr   = (void*)ck_mem;
    ckpnt[i].next_addr = (void*)ck_mem->ck_next;
    ckpnt[i].t0        = ck_mem->ck_t0;
    ckpnt[i].t1        = ck_mem->ck_t1;
    ckpnt[i].nstep     = ck_mem->ck_nst;
    ckpnt[i].order     = ck_mem->ck_q;
    ckpnt[i].step      = ck_mem->ck_h;

    ck_mem = ck_mem->ck_next;
    i++;
  }

  return (CV_SUCCESS);
}